

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8992ca70 comp,int bad_allowed,bool leftmost)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint *puVar9;
  uint *puVar10;
  _DistanceType __len;
  ulong uVar11;
  uint *puVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint *puVar17;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var18;
  int *piVar19;
  uint *puVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1213:36)>
  __cmp;
  int local_4c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  
  uVar11 = (long)end._M_current - (long)begin._M_current >> 2;
  if ((long)uVar11 < 0x18) {
    if (!leftmost) {
LAB_00269f39:
      if (begin._M_current == end._M_current) {
        return;
      }
      if ((uint *)begin._M_current + 1 == (uint *)end._M_current) {
        return;
      }
      pdVar4 = *comp.vals;
      puVar9 = (uint *)begin._M_current + 1;
      do {
        puVar12 = puVar9;
        uVar2 = ((uint *)begin._M_current)[1];
        lVar5 = (long)*begin._M_current;
        dVar27 = ABS(pdVar4[(int)uVar2]);
        puVar9 = puVar12;
        if ((ABS(pdVar4[lVar5]) < dVar27) ||
           ((*begin._M_current < (int)uVar2 && (ABS(pdVar4[lVar5]) <= dVar27)))) {
          while( true ) {
            *puVar9 = (uint)lVar5;
            lVar5 = (long)(int)puVar9[-2];
            if ((dVar27 <= ABS(pdVar4[lVar5])) &&
               (((int)uVar2 <= (int)puVar9[-2] || (dVar27 < ABS(pdVar4[lVar5]))))) break;
            puVar9 = puVar9 + -1;
          }
          puVar9[-1] = uVar2;
        }
        puVar9 = puVar12 + 1;
        begin._M_current = (int *)puVar12;
      } while (puVar12 + 1 != (uint *)end._M_current);
      return;
    }
  }
  else {
    puVar9 = (uint *)(end._M_current + -1);
    lVar5 = (long)end._M_current - (long)begin._M_current;
    local_4c = bad_allowed;
    local_48._M_current = begin._M_current;
    do {
      uVar6 = uVar11 >> 1;
      pdVar4 = *comp.vals;
      if (uVar11 < 0x81) {
        uVar7 = *local_48._M_current;
        uVar2 = local_48._M_current[uVar6];
        dVar27 = ABS(pdVar4[(int)uVar7]);
        dVar26 = ABS(pdVar4[(int)uVar2]);
        if ((dVar26 < dVar27) || (((int)uVar2 < (int)uVar7 && (dVar26 <= dVar27)))) {
          local_48._M_current[uVar6] = uVar7;
          *local_48._M_current = uVar2;
          dVar27 = dVar26;
          uVar7 = uVar2;
        }
        uVar2 = *puVar9;
        if ((dVar27 < ABS(pdVar4[(int)uVar2])) ||
           (((int)uVar7 < (int)uVar2 && (dVar27 <= ABS(pdVar4[(int)uVar2]))))) {
          *local_48._M_current = uVar2;
          *puVar9 = uVar7;
          uVar7 = *local_48._M_current;
        }
        uVar2 = local_48._M_current[uVar6];
        if ((ABS(pdVar4[(int)uVar2]) < ABS(pdVar4[(int)uVar7])) ||
           (((int)uVar2 < (int)uVar7 && (ABS(pdVar4[(int)uVar2]) <= ABS(pdVar4[(int)uVar7]))))) {
          local_48._M_current[uVar6] = uVar7;
          *local_48._M_current = uVar2;
          uVar7 = uVar2;
        }
      }
      else {
        uVar7 = local_48._M_current[uVar6];
        uVar2 = *local_48._M_current;
        dVar27 = ABS(pdVar4[(int)uVar7]);
        dVar26 = ABS(pdVar4[(int)uVar2]);
        if ((dVar26 < dVar27) || (((int)uVar2 < (int)uVar7 && (dVar26 <= dVar27)))) {
          *local_48._M_current = uVar7;
          local_48._M_current[uVar6] = uVar2;
          dVar27 = dVar26;
          uVar7 = uVar2;
        }
        uVar2 = *puVar9;
        if ((dVar27 < ABS(pdVar4[(int)uVar2])) ||
           (((int)uVar7 < (int)uVar2 && (dVar27 <= ABS(pdVar4[(int)uVar2]))))) {
          local_48._M_current[uVar6] = uVar2;
          *puVar9 = uVar7;
          uVar7 = local_48._M_current[uVar6];
        }
        iVar15 = *local_48._M_current;
        if ((ABS(pdVar4[iVar15]) < ABS(pdVar4[(int)uVar7])) ||
           ((iVar15 < (int)uVar7 && (ABS(pdVar4[iVar15]) <= ABS(pdVar4[(int)uVar7]))))) {
          *local_48._M_current = uVar7;
          local_48._M_current[uVar6] = iVar15;
        }
        iVar8 = local_48._M_current[uVar6 - 1];
        iVar15 = local_48._M_current[1];
        dVar27 = ABS(pdVar4[iVar8]);
        dVar26 = ABS(pdVar4[iVar15]);
        if ((dVar26 < dVar27) || ((iVar15 < iVar8 && (dVar26 <= dVar27)))) {
          local_48._M_current[1] = iVar8;
          local_48._M_current[uVar6 - 1] = iVar15;
          dVar27 = dVar26;
          iVar8 = iVar15;
        }
        iVar15 = end._M_current[-2];
        if ((dVar27 < ABS(pdVar4[iVar15])) || ((iVar8 < iVar15 && (dVar27 <= ABS(pdVar4[iVar15])))))
        {
          local_48._M_current[uVar6 - 1] = iVar15;
          end._M_current[-2] = iVar8;
          iVar8 = local_48._M_current[uVar6 - 1];
        }
        iVar15 = local_48._M_current[1];
        if ((ABS(pdVar4[iVar15]) < ABS(pdVar4[iVar8])) ||
           ((iVar15 < iVar8 && (ABS(pdVar4[iVar15]) <= ABS(pdVar4[iVar8]))))) {
          local_48._M_current[1] = iVar8;
          local_48._M_current[uVar6 - 1] = iVar15;
        }
        iVar8 = local_48._M_current[uVar6 + 1];
        iVar15 = local_48._M_current[2];
        dVar27 = ABS(pdVar4[iVar8]);
        dVar26 = ABS(pdVar4[iVar15]);
        if ((dVar26 < dVar27) || ((iVar15 < iVar8 && (dVar26 <= dVar27)))) {
          local_48._M_current[2] = iVar8;
          local_48._M_current[uVar6 + 1] = iVar15;
          dVar27 = dVar26;
          iVar8 = iVar15;
        }
        iVar15 = end._M_current[-3];
        if ((dVar27 < ABS(pdVar4[iVar15])) || ((iVar8 < iVar15 && (dVar27 <= ABS(pdVar4[iVar15])))))
        {
          local_48._M_current[uVar6 + 1] = iVar15;
          end._M_current[-3] = iVar8;
          iVar8 = local_48._M_current[uVar6 + 1];
        }
        iVar15 = local_48._M_current[2];
        if ((ABS(pdVar4[iVar15]) < ABS(pdVar4[iVar8])) ||
           ((iVar15 < iVar8 && (ABS(pdVar4[iVar15]) <= ABS(pdVar4[iVar8]))))) {
          local_48._M_current[2] = iVar8;
          local_48._M_current[uVar6 + 1] = iVar15;
          iVar8 = iVar15;
        }
        iVar15 = local_48._M_current[uVar6];
        iVar3 = local_48._M_current[uVar6 - 1];
        dVar27 = ABS(pdVar4[iVar15]);
        dVar26 = ABS(pdVar4[iVar3]);
        if ((dVar26 < dVar27) || ((iVar14 = iVar3, iVar3 < iVar15 && (dVar26 <= dVar27)))) {
          local_48._M_current[uVar6 - 1] = iVar15;
          local_48._M_current[uVar6] = iVar3;
          dVar27 = dVar26;
          iVar14 = iVar15;
          iVar15 = iVar3;
        }
        lVar16 = (long)iVar8;
        if ((dVar27 < ABS(pdVar4[lVar16])) || ((iVar15 < iVar8 && (dVar27 <= ABS(pdVar4[lVar16])))))
        {
          local_48._M_current[uVar6] = iVar8;
          local_48._M_current[uVar6 + 1] = iVar15;
          iVar15 = iVar8;
        }
        else {
          lVar16 = (long)iVar15;
        }
        if ((ABS(pdVar4[iVar14]) < ABS(pdVar4[lVar16])) ||
           ((iVar14 < iVar15 && (ABS(pdVar4[iVar14]) <= ABS(pdVar4[lVar16]))))) {
          local_48._M_current[uVar6 - 1] = iVar15;
          local_48._M_current[uVar6] = iVar14;
          iVar15 = iVar14;
        }
        iVar8 = *local_48._M_current;
        *local_48._M_current = iVar15;
        local_48._M_current[uVar6] = iVar8;
        uVar7 = *local_48._M_current;
      }
      if ((leftmost & 1U) == 0) {
        dVar27 = ABS(pdVar4[(int)uVar7]);
        if ((dVar27 < ABS(pdVar4[local_48._M_current[-1]])) ||
           (((int)uVar7 < local_48._M_current[-1] &&
            (dVar27 <= ABS(pdVar4[local_48._M_current[-1]]))))) goto LAB_002699b7;
        lVar5 = 0;
        while( true ) {
          lVar16 = (long)*(int *)((long)puVar9 + lVar5);
          if ((dVar27 <= ABS(pdVar4[lVar16])) &&
             (((int)uVar7 <= *(int *)((long)puVar9 + lVar5) || (dVar27 < ABS(pdVar4[lVar16])))))
          break;
          lVar5 = lVar5 + -4;
        }
        puVar12 = (uint *)((long)puVar9 + lVar5);
        if (lVar5 == 0) {
          uVar11 = (ulong)uVar7;
          _Var13._M_current = local_48._M_current;
          while (_Var13._M_current < puVar12) {
            _Var13._M_current = _Var13._M_current + 1;
            uVar11 = (ulong)*_Var13._M_current;
            if ((ABS(pdVar4[uVar11]) < dVar27) ||
               (*_Var13._M_current < (int)uVar7 && ABS(pdVar4[uVar11]) <= dVar27)) break;
          }
        }
        else {
          puVar10 = (uint *)(local_48._M_current + 1);
          do {
            _Var13._M_current = (int *)puVar10;
            uVar11 = (ulong)*_Var13._M_current;
            if (ABS(pdVar4[uVar11]) < dVar27) break;
            puVar10 = (uint *)_Var13._M_current + 1;
          } while (((int)uVar7 <= *_Var13._M_current) || (dVar27 < ABS(pdVar4[uVar11])));
        }
LAB_00269f0d:
        if (_Var13._M_current < puVar12) {
          *_Var13._M_current = (uint)lVar16;
          *puVar12 = (uint)uVar11;
          do {
            do {
              puVar12 = puVar12 + -1;
              lVar16 = (long)(int)*puVar12;
            } while (ABS(pdVar4[lVar16]) < dVar27);
          } while (((int)*puVar12 < (int)uVar7) && (ABS(pdVar4[lVar16]) <= dVar27));
          puVar10 = (uint *)_Var13._M_current + 1;
          do {
            _Var13._M_current = (int *)puVar10;
            uVar11 = (ulong)*_Var13._M_current;
            if (ABS(pdVar4[uVar11]) < dVar27) break;
            puVar10 = (uint *)_Var13._M_current + 1;
          } while (((int)uVar7 <= *_Var13._M_current) || (dVar27 < ABS(pdVar4[uVar11])));
          goto LAB_00269f0d;
        }
        *local_48._M_current = (uint)lVar16;
        *puVar12 = uVar7;
        begin._M_current = (int *)(puVar12 + 1);
        lVar16 = (long)end._M_current - (long)begin._M_current;
        uVar11 = lVar16 >> 2;
      }
      else {
        dVar27 = ABS(pdVar4[(int)uVar7]);
LAB_002699b7:
        uVar6 = 4;
        while( true ) {
          lVar16 = (long)*(local_48._M_current + uVar6);
          if ((ABS(pdVar4[lVar16]) <= dVar27) &&
             ((*(local_48._M_current + uVar6) <= (int)uVar7 || (ABS(pdVar4[lVar16]) < dVar27))))
          break;
          uVar6 = uVar6 + 4;
        }
        puVar12 = (uint *)((long)local_48._M_current + uVar6);
        puVar10 = puVar9;
        if (uVar6 == 4) {
          while (puVar20 = puVar10, puVar17 = puVar20 + 1, puVar12 < puVar20 + 1) {
            puVar17 = puVar20;
            if ((dVar27 < ABS(pdVar4[(int)*puVar20])) ||
               ((puVar10 = puVar20 + -1, (int)uVar7 < (int)*puVar20 &&
                (dVar27 <= ABS(pdVar4[(int)*puVar20]))))) break;
          }
        }
        else {
          do {
            puVar17 = puVar10;
            if (dVar27 < ABS(pdVar4[(int)*puVar17])) break;
            puVar10 = puVar17 + -1;
          } while (((int)*puVar17 <= (int)uVar7) || (ABS(pdVar4[(int)*puVar17]) < dVar27));
        }
        if (puVar12 < puVar17) {
          uVar24 = (ulong)*puVar17;
          puVar10 = puVar17;
          do {
            *(int *)((long)local_48._M_current + uVar6) = (int)uVar24;
            *puVar10 = (uint)lVar16;
            uVar21 = uVar6;
            while( true ) {
              iVar15 = *(local_48._M_current + uVar21 + 4);
              lVar16 = (long)iVar15;
              if ((ABS(pdVar4[lVar16]) <= dVar27) &&
                 ((iVar15 <= (int)uVar7 || (ABS(pdVar4[lVar16]) < dVar27)))) break;
              uVar21 = uVar21 + 4;
            }
            uVar6 = uVar21 + 4;
            puVar20 = puVar10 + -1;
            do {
              puVar10 = puVar20;
              uVar24 = (ulong)(int)*puVar10;
              if (dVar27 < ABS(pdVar4[uVar24])) break;
              puVar20 = puVar10 + -1;
            } while (((int)*puVar10 <= (int)uVar7) || (ABS(pdVar4[uVar24]) < dVar27));
          } while ((uint *)((long)local_48._M_current + uVar21 + 4) < puVar10);
        }
        else {
          uVar21 = uVar6 - 4;
        }
        _Var13._M_current = local_48._M_current + uVar21;
        puVar10 = (uint *)((long)local_48._M_current + uVar21);
        begin._M_current = (int *)(puVar10 + 1);
        *local_48._M_current = *puVar10;
        *puVar10 = uVar7;
        uVar6 = (long)_Var13._M_current - (long)local_48._M_current >> 2;
        lVar16 = (long)end._M_current - (long)begin._M_current;
        uVar24 = lVar16 >> 2;
        if (((long)uVar6 < (long)(uVar11 >> 3)) || ((long)uVar24 < (long)(uVar11 >> 3))) {
          local_4c = local_4c + -1;
          if (local_4c == 0) {
            uVar6 = uVar11 - 2 >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>>
                        (local_48,uVar6,uVar11,local_48._M_current[uVar6],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1213:36)>
                          )comp.vals);
              bVar25 = uVar6 != 0;
              uVar6 = uVar6 - 1;
            } while (bVar25);
            if (lVar5 < 5) {
              return;
            }
            lVar5 = (long)end._M_current - (long)local_48._M_current;
            do {
              end._M_current = end._M_current + -1;
              iVar15 = *end._M_current;
              *end._M_current = *local_48._M_current;
              lVar5 = lVar5 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>>
                        (local_48,0,lVar5 >> 2,iVar15,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1213:36)>
                          )comp.vals);
            } while (4 < lVar5);
            return;
          }
          if (0x17 < (long)uVar6) {
            uVar11 = uVar6 & 0xfffffffffffffffc;
            iVar15 = *local_48._M_current;
            *local_48._M_current = *(local_48._M_current + uVar11);
            *(local_48._M_current + uVar11) = iVar15;
            iVar15 = _Var13._M_current[-1];
            _Var13._M_current[-1] = *(_Var13._M_current - uVar11);
            *(_Var13._M_current - uVar11) = iVar15;
            if (0x80 < uVar6) {
              uVar6 = uVar6 >> 2;
              iVar15 = local_48._M_current[1];
              local_48._M_current[1] = local_48._M_current[uVar6 + 1];
              local_48._M_current[uVar6 + 1] = iVar15;
              iVar15 = local_48._M_current[2];
              local_48._M_current[2] = local_48._M_current[uVar6 + 2];
              local_48._M_current[uVar6 + 2] = iVar15;
              iVar15 = _Var13._M_current[-2];
              _Var13._M_current[-2] = _Var13._M_current[~uVar6];
              _Var13._M_current[~uVar6] = iVar15;
              iVar15 = _Var13._M_current[-3];
              _Var13._M_current[-3] = _Var13._M_current[-2 - uVar6];
              _Var13._M_current[-2 - uVar6] = iVar15;
            }
          }
          if (0x17 < (long)uVar24) {
            uVar11 = uVar24 & 0xfffffffffffffffc;
            iVar15 = _Var13._M_current[1];
            _Var13._M_current[1] = *(_Var13._M_current + uVar11 + 4);
            *(_Var13._M_current + uVar11 + 4) = iVar15;
            iVar15 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar11);
            *(end._M_current - uVar11) = iVar15;
            if (0x80 < uVar24) {
              uVar11 = uVar24 >> 2;
              iVar15 = _Var13._M_current[2];
              _Var13._M_current[2] = _Var13._M_current[uVar11 + 2];
              _Var13._M_current[uVar11 + 2] = iVar15;
              iVar15 = _Var13._M_current[3];
              _Var13._M_current[3] = _Var13._M_current[uVar11 + 3];
              _Var13._M_current[uVar11 + 3] = iVar15;
              iVar15 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar11];
              end._M_current[~uVar11] = iVar15;
              iVar15 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar11];
              end._M_current[-2 - uVar11] = iVar15;
            }
          }
        }
        else if (puVar17 <= puVar12) {
          if ((uVar21 & 0xfffffffffffffffb) != 0) {
            lVar5 = 0;
            uVar11 = 0;
            _Var18._M_current = local_48._M_current;
            piVar19 = local_48._M_current + 1;
            do {
              iVar15 = _Var18._M_current[1];
              iVar8 = *_Var18._M_current;
              dVar27 = ABS(pdVar4[iVar15]);
              if ((ABS(pdVar4[iVar8]) < dVar27) ||
                 ((iVar8 < iVar15 && (ABS(pdVar4[iVar8]) <= dVar27)))) {
                _Var18._M_current[1] = iVar8;
                _Var18._M_current = local_48._M_current;
                lVar22 = lVar5;
                if (piVar19 + -1 != local_48._M_current) {
                  do {
                    iVar8 = *(local_48._M_current + lVar22 + -4);
                    if ((dVar27 <= ABS(pdVar4[iVar8])) &&
                       ((iVar15 <= iVar8 || (dVar27 < ABS(pdVar4[iVar8]))))) {
                      _Var18._M_current = lVar22 + local_48._M_current;
                      break;
                    }
                    *(local_48._M_current + lVar22) = iVar8;
                    lVar22 = lVar22 + -4;
                  } while (lVar22 != 0);
                }
                *_Var18._M_current = iVar15;
                uVar11 = uVar11 + ((long)piVar19 - (long)_Var18._M_current >> 2);
                if (8 < uVar11) goto LAB_00269dc1;
              }
              piVar1 = piVar19 + 1;
              lVar5 = lVar5 + 4;
              _Var18._M_current = piVar19;
              piVar19 = piVar1;
            } while (piVar1 != _Var13._M_current);
          }
          if (begin._M_current == end._M_current) {
            return;
          }
          if (_Var13._M_current + 2 == end._M_current) {
            return;
          }
          lVar5 = 8;
          lVar22 = 0;
          uVar11 = 0;
          puVar12 = (uint *)begin._M_current;
          do {
            uVar2 = *puVar12;
            puVar12 = (uint *)((long)_Var13._M_current + lVar5);
            uVar7 = *(uint *)((long)_Var13._M_current + lVar5);
            dVar27 = ABS(pdVar4[(int)uVar7]);
            if ((ABS(pdVar4[(int)uVar2]) < dVar27) ||
               (((int)uVar2 < (int)uVar7 && (ABS(pdVar4[(int)uVar2]) <= dVar27)))) {
              *puVar12 = uVar2;
              puVar17 = (uint *)begin._M_current;
              lVar23 = lVar22;
              if (lVar5 != 8) {
                do {
                  iVar15 = *(int *)((long)puVar10 + lVar23);
                  if ((dVar27 <= ABS(pdVar4[iVar15])) &&
                     (((int)uVar7 <= iVar15 || (dVar27 < ABS(pdVar4[iVar15]))))) {
                    puVar17 = (uint *)(lVar23 + (long)begin._M_current);
                    break;
                  }
                  *(int *)((long)begin._M_current + lVar23) = iVar15;
                  lVar23 = lVar23 + -4;
                } while (lVar23 != 0);
              }
              *puVar17 = uVar7;
              uVar11 = uVar11 + ((long)puVar12 - (long)puVar17 >> 2);
              if (8 < uVar11) break;
            }
            lVar23 = lVar5 + 4;
            lVar5 = lVar5 + 4;
            lVar22 = lVar22 + 4;
            if (_Var13._M_current + lVar23 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_00269dc1:
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1,false>
                  (local_48,_Var13,comp,local_4c,(bool)(leftmost & 1));
        leftmost = false;
        uVar11 = uVar24;
      }
      lVar5 = lVar16;
      local_48._M_current = begin._M_current;
    } while (0x17 < (long)uVar11);
    if ((leftmost & 1U) == 0) goto LAB_00269f39;
  }
  if ((begin._M_current != end._M_current) &&
     ((uint *)begin._M_current + 1 != (uint *)end._M_current)) {
    pdVar4 = *comp.vals;
    lVar5 = 0;
    puVar9 = (uint *)begin._M_current;
    puVar12 = (uint *)begin._M_current + 1;
    do {
      uVar2 = puVar9[1];
      uVar7 = *puVar9;
      dVar27 = ABS(pdVar4[(int)uVar2]);
      if ((ABS(pdVar4[(int)uVar7]) < dVar27) ||
         (((int)uVar7 < (int)uVar2 && (ABS(pdVar4[(int)uVar7]) <= dVar27)))) {
        puVar9[1] = uVar7;
        puVar9 = (uint *)begin._M_current;
        lVar16 = lVar5;
        if (puVar12 + -1 != (uint *)begin._M_current) {
          do {
            iVar15 = *(begin._M_current + lVar16 + -4);
            if ((dVar27 <= ABS(pdVar4[iVar15])) &&
               (((int)uVar2 <= iVar15 || (dVar27 < ABS(pdVar4[iVar15]))))) {
              puVar9 = (uint *)(lVar16 + (long)begin._M_current);
              break;
            }
            *(begin._M_current + lVar16) = iVar15;
            lVar16 = lVar16 + -4;
          } while (lVar16 != 0);
        }
        *puVar9 = uVar2;
      }
      puVar10 = puVar12 + 1;
      lVar5 = lVar5 + 4;
      puVar9 = puVar12;
      puVar12 = puVar10;
    } while (puVar10 != (uint *)end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }